

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::BlitColorConversionCase::compare
          (BlitColorConversionCase *this,Surface *reference,Surface *result)

{
  bool bVar1;
  bool bVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  int b;
  MessageBuilder local_1e8;
  deUint32 local_68;
  deUint32 local_64;
  deUint32 local_60;
  deUint32 local_5c;
  RGBA local_58;
  RGBA dstMaxDiff;
  RGBA srcMaxDiff;
  RGBA threshold;
  bool dstIsSRGB;
  TextureFormat TStack_30;
  bool srcIsSRGB;
  TextureFormat dstFormat;
  TextureFormat srcFormat;
  Surface *result_local;
  Surface *reference_local;
  BlitColorConversionCase *this_local;
  
  dstFormat = glu::mapGLInternalFormat(this->m_srcFormat);
  TStack_30 = glu::mapGLInternalFormat(this->m_dstFormat);
  bVar1 = tcu::isSRGB(dstFormat);
  bVar2 = tcu::isSRGB(TStack_30);
  tcu::RGBA::RGBA(&srcMaxDiff);
  if (bVar2) {
    srcMaxDiff = FboTestUtil::getToSRGBConversionThreshold(&dstFormat,&stack0xffffffffffffffd0);
  }
  else {
    local_58 = FboTestUtil::getFormatThreshold(&dstFormat);
    b = 1;
    if (bVar1) {
      b = 2;
    }
    dstMaxDiff = tcu::operator*(&local_58,b);
    local_68 = (deUint32)FboTestUtil::getFormatThreshold(&stack0xffffffffffffffd0);
    local_64 = dstMaxDiff.m_value;
    local_5c = local_68;
    local_60 = (deUint32)tcu::max(dstMaxDiff,(RGBA)local_68);
    srcMaxDiff = (RGBA)local_60;
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_1e8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [13])0x2c73c46);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&srcMaxDiff);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  bVar1 = tcu::pixelThresholdCompare
                    (pTVar3,"Result","Image comparison result",reference,result,&srcMaxDiff,
                     COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::TextureFormat	srcFormat	= glu::mapGLInternalFormat(m_srcFormat);
		const tcu::TextureFormat	dstFormat	= glu::mapGLInternalFormat(m_dstFormat);
		const bool					srcIsSRGB	= tcu::isSRGB(srcFormat);
		const bool					dstIsSRGB	= tcu::isSRGB(dstFormat);

		tcu::RGBA					threshold;

		if (dstIsSRGB)
		{
			threshold = getToSRGBConversionThreshold(srcFormat, dstFormat);
		}
		else
		{
			const tcu::RGBA	srcMaxDiff	= getFormatThreshold(srcFormat) * (srcIsSRGB ? 2 : 1);
			const tcu::RGBA	dstMaxDiff	= getFormatThreshold(dstFormat);

			threshold = tcu::max(srcMaxDiff, dstMaxDiff);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "threshold = " << threshold << tcu::TestLog::EndMessage;
		return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, tcu::COMPARE_LOG_RESULT);
	}